

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O1

void color_theme_destroy(color_theme *theme)

{
  if (theme->unfocused != (color_value *)0x0) {
    free(theme->unfocused);
  }
  if (theme->focused != (color_value *)0x0) {
    free(theme->focused);
  }
  if (theme->urgent != (color_value *)0x0) {
    free(theme->urgent);
  }
  if (theme->sticky != (color_value *)0x0) {
    free(theme->sticky);
  }
  free(theme);
  return;
}

Assistant:

void color_theme_destroy(struct color_theme *theme)
{
        if (theme->unfocused != NULL) {
                color_value_destroy(theme->unfocused);
        }

        if (theme->focused != NULL) {
                color_value_destroy(theme->focused);
        }

        if (theme->urgent != NULL) {
                color_value_destroy(theme->urgent);
        }

        if (theme->sticky != NULL) {
                color_value_destroy(theme->sticky);
        }

        free(theme);
}